

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_model.hpp
# Opt level: O0

int __thiscall
BaseModel::collectChessboardCorners
          (BaseModel *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *image_list,Size *board_size,Size *square_size,Size *image_size,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *image_list_detected,bool show_result)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  size_type sVar4;
  ostream *poVar5;
  const_reference pvVar6;
  undefined1 local_1d8 [7];
  char key;
  allocator local_1b9;
  string local_1b8 [32];
  Scalar_<double> local_198;
  Point_<int> local_178;
  _InputOutputArray local_170;
  int local_154 [2];
  Size text_size;
  int base_line;
  string msg;
  undefined1 local_120 [7];
  bool found;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Mat image;
  ulong local_68;
  size_t i;
  undefined1 local_58 [4];
  int count;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> object_points;
  bool show_result_local;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  *object_points_list_local;
  Size *image_size_local;
  Size *square_size_local;
  Size *board_size_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *image_list_local;
  BaseModel *this_local;
  
  object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = show_result;
  createChessboardCorners
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_58,this,
             board_size,square_size);
  i._4_4_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(image_list_detected);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::clear(object_points_list);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::clear(image_points_list);
  for (local_68 = 0;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(image_list), local_68 < sVar4; local_68 = local_68 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Load image: ");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](image_list,local_68);
    std::operator<<(poVar5,(string *)pvVar6);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](image_list,local_68);
    cv::imread((string *)local_d8,(int)pvVar6);
    bVar1 = cv::Mat::empty();
    if ((bVar1 & 1) == 0) {
      cv::Size_<int>::Size_
                ((Size_<int> *)
                 ((long)&image_points.
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,0);
      bVar2 = cv::operator==(image_size,
                             (Size_<int> *)
                             ((long)&image_points.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (bVar2) {
        image_size->width = image.dims;
        image_size->height = image.flags;
      }
      bVar2 = false;
      if (image_size->width == image.dims) {
        bVar2 = image_size->height == image.flags;
      }
      if (!bVar2) {
        __assert_fail("image_size.width == image.cols and image_size.height == image.rows",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sleepbysleep[P]extensive_calibrate/base_model.hpp"
                      ,0x19a,
                      "int BaseModel::collectChessboardCorners(const std::vector<std::string> &, const cv::Size &, const cv::Size &, cv::Size &, std::vector<std::vector<cv::Point3f>> &, std::vector<std::vector<cv::Point2f>> &, std::vector<std::string> &, bool)"
                     );
      }
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120);
      bVar2 = detectChessboardCorners
                        (this,(Mat *)local_d8,board_size,
                         (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120
                         ,(bool)(object_points.
                                 super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      if (bVar2) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](image_list,local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(image_list_detected,pvVar6);
        std::
        vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
        ::push_back(object_points_list,(value_type *)local_58);
        std::
        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ::push_back(image_points_list,(value_type *)local_120);
        i._4_4_ = i._4_4_ + 1;
      }
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(image_list);
      cv::format_abi_cxx11_
                ((char *)&text_size.height,"%d/%d",(ulong)((int)local_68 + 1),sVar4 & 0xffffffff);
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 " Detecting crosses of chessboard complete - ");
        poVar5 = std::operator<<(poVar5,(string *)&text_size.height);
        std::operator<<(poVar5,"\n");
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout," Detecting crosses of chessboard failed! - "
                                );
        poVar5 = std::operator<<(poVar5,(string *)&text_size.height);
        std::operator<<(poVar5,"\n");
      }
      if ((object_points.
           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        text_size.width = 0;
        cv::getTextSize((string *)local_154,(int)&text_size + 4,1.0,1,(int *)0x1);
        cv::_InputOutputArray::_InputOutputArray(&local_170,(Mat *)local_d8);
        cv::Point_<int>::Point_(&local_178,local_154[0] + 10,text_size.width * 2 + 10);
        cv::Scalar_<double>::Scalar_(&local_198,0.0,0.0,255.0,0.0);
        cv::putText(0x3ff0000000000000,&local_170,&text_size.height,&local_178,1,&local_198,1,8,0);
        cv::_InputOutputArray::~_InputOutputArray(&local_170);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b8,"Image",&local_1b9);
        cv::_InputArray::_InputArray((_InputArray *)local_1d8,(Mat *)local_d8);
        cv::imshow(local_1b8,(_InputArray *)local_1d8);
        cv::_InputArray::~_InputArray((_InputArray *)local_1d8);
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        cVar3 = cv::waitKey(500);
        if (((cVar3 == '\x1b') || (cVar3 == 'q')) || (cVar3 == 'Q')) {
          exit(-1);
        }
      }
      std::__cxx11::string::~string((string *)&text_size.height);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120);
      bVar2 = false;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](image_list,local_68);
      std::operator+((char *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Invalid image path: ");
      poVar5 = std::operator<<((ostream *)&std::cerr,local_f8);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_f8);
      bVar2 = true;
    }
    cv::Mat::~Mat((Mat *)local_d8);
    if (bVar2) break;
  }
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_58);
  return i._4_4_;
}

Assistant:

int collectChessboardCorners(
    const std::vector<std::string>& image_list,
    const cv::Size& board_size,
    const cv::Size& square_size,
    cv::Size& image_size,
    std::vector<std::vector<cv::Point3f>>& object_points_list,
    std::vector<std::vector<cv::Point2f>>& image_points_list,
    std::vector<std::string>& image_list_detected,
    bool show_result=true
  ) {
    std::vector<cv::Point3f> object_points = this->createChessboardCorners(board_size, square_size);

    int count = 0;
    image_list_detected.clear();
    object_points_list.clear();
    image_points_list.clear();
    for (size_t i = 0; i < image_list.size(); ++i) {
      if (DEBUG) std::cout << "Load image: " << image_list[i];
    
      cv::Mat image = cv::imread(image_list[i], cv::IMREAD_COLOR);
      if (image.empty()) {
	std::cerr << "Invalid image path: " + image_list[i] << std::endl;
	break;
      }

      if (image_size == cv::Size(0,0)) {
	image_size.width = image.cols;
	image_size.height = image.rows;
      }
      assert(image_size.width == image.cols and image_size.height == image.rows);
      
      std::vector<cv::Point2f> image_points;
      bool found = this->detectChessboardCorners(
	image,
	board_size,
	image_points,
	show_result
      );
      
      if (found) {
	image_list_detected.push_back(image_list[i]);
	object_points_list.push_back(object_points);
	image_points_list.push_back(image_points);
	++count;
      }

      std::string msg = cv::format("%d/%d", (int)(i+1), (int)image_list.size());
      if (DEBUG) {
	if (found) {
	  std::cout << " Detecting crosses of chessboard complete - " << msg << "\n";
	} else {
	  std::cout << " Detecting crosses of chessboard failed! - " << msg << "\n";
	}
      }

      if (show_result) {
	//cv::drawChessboardCorners(image, board_size, cv::Mat(image_points), found);

	int base_line = 0;
	cv::Size text_size = cv::getTextSize(msg, 1, 1, 1, &base_line);

	cv::putText(image, msg,
		    cv::Point(10 + text_size.width, 10 + 2 * base_line),
		    1, 1, cv::Scalar(0,0,255));
	cv::imshow("Image", image);
	char key = (char)cv::waitKey(500);
	if (key == 27 || key == 'q' || key == 'Q') {
	  exit(-1);
	}
      }
    }
    return count;
  }